

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::LoopHeader::Init(LoopHeader *this,FunctionBody *functionBody)

{
  CriticalSection *this_00;
  ScriptContext *pSVar1;
  ThreadContext *this_01;
  Recycler *alloc;
  SynchronizableList<Js::LoopEntryPointInfo_*,_JsUtil::List<Js::LoopEntryPointInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *ptr;
  TrackAllocData local_50;
  CriticalSection *local_28;
  CriticalSection *syncObj;
  Recycler *recycler;
  FunctionBody *functionBody_local;
  LoopHeader *this_local;
  
  recycler = (Recycler *)functionBody;
  functionBody_local = (FunctionBody *)this;
  Memory::WriteBarrierPtr<Js::FunctionBody>::operator=(&this->functionBody,functionBody);
  pSVar1 = FunctionProxy::GetScriptContext((FunctionProxy *)recycler);
  syncObj = (CriticalSection *)ScriptContext::GetRecycler(pSVar1);
  pSVar1 = FunctionProxy::GetScriptContext((FunctionProxy *)recycler);
  this_01 = ScriptContext::GetThreadContext(pSVar1);
  local_28 = ThreadContext::GetFunctionBodyLock(this_01);
  this_00 = syncObj;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,
             (type_info *)
             &SynchronizableList<Js::LoopEntryPointInfo*,JsUtil::List<Js::LoopEntryPointInfo*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>,Js::DefaultContainerLockPolicy,CriticalSection>
              ::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
             ,0x2529);
  alloc = Memory::Recycler::TrackAllocInfo((Recycler *)this_00,&local_50);
  ptr = (SynchronizableList<Js::LoopEntryPointInfo_*,_JsUtil::List<Js::LoopEntryPointInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
         *)new<Memory::Recycler>(0x38,alloc,0x43c4b0);
  SynchronizableList<Js::LoopEntryPointInfo*,JsUtil::List<Js::LoopEntryPointInfo*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>,Js::DefaultContainerLockPolicy,CriticalSection>
  ::SynchronizableList<Memory::Recycler*>
            ((SynchronizableList<Js::LoopEntryPointInfo*,JsUtil::List<Js::LoopEntryPointInfo*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>,Js::DefaultContainerLockPolicy,CriticalSection>
              *)ptr,(Recycler *)syncObj,local_28);
  Memory::
  WriteBarrierPtr<Js::SynchronizableList<Js::LoopEntryPointInfo_*,_JsUtil::List<Js::LoopEntryPointInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>_>
  ::operator=(&this->entryPoints,ptr);
  CreateEntryPoint(this);
  return;
}

Assistant:

void LoopHeader::Init( FunctionBody * functionBody )
    {
        // DisableJIT-TODO: Should this entire class be ifdefed out?
#if ENABLE_NATIVE_CODEGEN
        this->functionBody = functionBody;
        Recycler* recycler = functionBody->GetScriptContext()->GetRecycler();

        // Sync entryPoints changes to etw rundown lock
        auto syncObj = functionBody->GetScriptContext()->GetThreadContext()->GetFunctionBodyLock();
        this->entryPoints = RecyclerNew(recycler, LoopEntryPointList, recycler, syncObj);

        this->CreateEntryPoint();
#endif
    }